

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  N_Vector y;
  long lVar3;
  long lVar4;
  FILE *__s;
  char *pcVar5;
  double dVar6;
  double rtol;
  sunrealtype in_XMM2_Qa;
  void *arkode_mem;
  sunrealtype t;
  SUNContext ctx;
  sunrealtype lamda;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long local_b0;
  double local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  long local_90;
  double local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_98 = 0xc059000000000000;
  local_b0 = 0;
  uVar1 = SUNContext_Create(0,&local_a0);
  if ((int)uVar1 < 0) {
    pcVar5 = "SUNContext_Create";
  }
  else {
    puts("\nAnalytical ODE test problem:");
    printf("    lamda = %g\n",local_98);
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    y = (N_Vector)N_VNew_Serial(1,local_a0);
    if (y == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    N_VConst(0,y);
    local_b0 = ARKStepCreate(0,0,f,y,local_a0);
    if (local_b0 == 0) {
      main_cold_3();
      return 1;
    }
    uVar1 = ARKodeSetUserData(local_b0,&local_98);
    if ((int)uVar1 < 0) {
      pcVar5 = "ARKodeSetUserData";
    }
    else {
      uVar1 = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,local_b0);
      if ((int)uVar1 < 0) {
        pcVar5 = "ARKodeSStolerances";
      }
      else {
        lVar3 = SUNDenseMatrix(1,1,local_a0);
        if (lVar3 == 0) {
          main_cold_2();
          return 1;
        }
        lVar4 = SUNLinSol_Dense(y,lVar3,local_a0);
        if (lVar4 == 0) {
          main_cold_1();
          return 1;
        }
        uVar1 = ARKodeSetLinearSolver(local_b0,lVar4,lVar3);
        if ((int)uVar1 < 0) {
          pcVar5 = "ARKodeSetLinearSolver";
        }
        else {
          uVar1 = ARKodeSetJacFn(local_b0,Jac);
          if ((int)uVar1 < 0) {
            pcVar5 = "ARKodeSetJacFn";
          }
          else {
            uVar1 = ARKodeSetLinear(local_b0,0);
            if (-1 < (int)uVar1) {
              local_90 = lVar4;
              __s = fopen("solution.txt","w");
              fwrite("# t u\n",6,1,__s);
              rtol = **(double **)((long)y->content + 0x10);
              fprintf(__s," %.16e %.16e\n",0);
              local_a8 = 0.0;
              puts("        t           u");
              puts("   ---------------------");
              if (1e-15 < 10.0 - local_a8) {
                dVar6 = 1.0;
                do {
                  local_88 = dVar6;
                  uVar1 = ARKodeEvolve(local_b0,y,&local_a8,1);
                  if ((int)uVar1 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                            "ARKodeEvolve",(ulong)uVar1);
                    break;
                  }
                  printf("  %10.6f  %10.6f\n",local_a8,**(undefined8 **)((long)y->content + 0x10));
                  fprintf(__s," %.16e %.16e\n",local_a8,**(undefined8 **)((long)y->content + 0x10));
                  in_XMM2_Qa = local_88 + 1.0;
                  rtol = 10.0 - local_a8;
                  dVar6 = 10.0;
                  if (in_XMM2_Qa <= 10.0) {
                    dVar6 = in_XMM2_Qa;
                  }
                } while (1e-15 < rtol);
              }
              puts("   ---------------------");
              fclose(__s);
              uVar1 = ARKodeGetNumSteps(local_b0,&local_38);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumSteps",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumStepAttempts(local_b0,&local_40);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumStepAttempts",(ulong)uVar1);
              }
              uVar1 = ARKStepGetNumRhsEvals(local_b0,&local_48,&local_50);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKStepGetNumRhsEvals",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumLinSolvSetups(local_b0,&local_58);
              lVar4 = local_90;
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumLinSolvSetups",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumErrTestFails(local_b0,&local_80);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumErrTestFails",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumNonlinSolvIters(local_b0,&local_70);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumNonlinSolvIters",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumNonlinSolvConvFails(local_b0,&local_78);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumJacEvals(local_b0,&local_60);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumJacEvals",(ulong)uVar1);
              }
              uVar1 = ARKodeGetNumLinRhsEvals(local_b0,&local_68);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                        "ARKodeGetNumLinRhsEvals",(ulong)uVar1);
              }
              puts("\nFinal Solver Statistics:");
              printf("   Internal solver steps = %li (attempted = %li)\n",local_38,local_40);
              printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_48,local_50);
              printf("   Total linear solver setups = %li\n",local_58);
              printf("   Total RHS evals for setting up the linear system = %li\n",local_68);
              printf("   Total number of Jacobian evaluations = %li\n",local_60);
              printf("   Total number of Newton iterations = %li\n",local_70);
              printf("   Total number of linear solver convergence failures = %li\n",local_78);
              printf("   Total number of error test failures = %li\n\n",local_80);
              iVar2 = check_ans(y,local_a8,rtol,in_XMM2_Qa);
              N_VDestroy(y);
              ARKodeFree(&local_b0);
              SUNLinSolFree(lVar4);
              SUNMatDestroy(lVar3);
              SUNContext_Free(&local_a0);
              return iVar2;
            }
            pcVar5 = "ARKodeSetLinear";
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar5,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)&lamda); /* Pass lamda to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 0);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", T0, NV_Ith_S(y, 0));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    fprintf(UFID, " %.16" ESYM " %.16" ESYM "\n", t, NV_Ith_S(y, 0));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");
  fclose(UFID);

  /* Get/print some final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}